

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
poly::
vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
::
push_back_new_elem_w_storage_increase<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>>
          (vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
           *this,long param_2)

{
  long lVar1;
  undefined8 *puVar2;
  code *pcVar3;
  void_pointer pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  __atomic_base<unsigned_long> _Var8;
  size_t a;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  long v;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  undefined8 *puVar21;
  undefined1 local_79;
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  local_78;
  undefined8 *local_68;
  undefined8 *puStack_60;
  ulong local_58;
  undefined8 *local_48;
  long local_40;
  vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
  *local_38;
  
  lVar9 = *(long *)this;
  lVar11 = *(long *)(this + 0x10);
  uVar20 = 1;
  if (0x27 < (ulong)(*(long *)(this + 0x18) - lVar9)) {
    uVar20 = (ulong)(*(long *)(this + 0x18) - lVar9) / 0x14 & 0xfffffffffffffffe;
  }
  uVar14 = 0x40;
  if (0x40 < *(ulong *)(this + 0x20)) {
    uVar14 = *(ulong *)(this + 0x20);
  }
  lVar1 = uVar14 - 1;
  uVar15 = (uVar14 - (uVar14 + 0xff) % uVar14) + 0xff;
  uVar18 = uVar14;
  lVar19 = lVar9;
  if (lVar9 == lVar11) {
    uVar16 = (lVar11 - lVar9 >> 3) * -0x3333333333333333;
    uVar12 = uVar15;
  }
  else {
    do {
      uVar12 = *(long *)(lVar19 + 0x18) + lVar1;
      uVar18 = (uVar18 - uVar12 % uVar14) + uVar12;
      lVar19 = lVar19 + 0x28;
    } while (lVar19 != lVar11);
    uVar16 = (lVar11 - lVar9 >> 3) * -0x3333333333333333;
    uVar12 = (uVar16 + uVar15 + uVar18) / (uVar16 + 1);
  }
  lVar9 = 0;
  if (uVar16 <= uVar20) {
    lVar9 = uVar20 - uVar16;
  }
  local_48 = (undefined8 *)(uVar20 * 0x28);
  local_68 = (undefined8 *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_78._storage = (undefined8 *)0x0;
  local_78._end_storage = (void_pointer)0x0;
  local_58 = 8;
  local_40 = param_2;
  vector_impl::
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  ::allocate(&local_78,uVar15 + (long)local_48 + uVar18 + lVar9 * uVar12);
  puVar21 = (undefined8 *)local_78._storage;
  local_68 = (undefined8 *)local_78._storage;
  puStack_60 = (undefined8 *)((long)local_78._storage + uVar20 * 5 * 8);
  puVar17 = *(undefined8 **)this;
  puVar2 = *(undefined8 **)(this + 0x10);
  local_58 = uVar14;
  local_38 = this;
  if (uVar20 != 0) {
    memset(local_78._storage,0,((uVar20 * 0x28 - 0x28) / 0x28) * 0x28 + 0x28);
  }
  puVar13 = (undefined8 *)((long)local_48 + (long)puVar21);
  local_48 = puVar13;
  if (puVar17 != puVar2) {
    do {
      pcVar3 = (code *)*puVar17;
      *puVar21 = pcVar3;
      uVar10 = puVar17[2];
      puVar21[2] = uVar10;
      uVar5 = *(undefined4 *)((long)puVar17 + 0x1c);
      uVar6 = *(undefined4 *)(puVar17 + 4);
      uVar7 = *(undefined4 *)((long)puVar17 + 0x24);
      *(undefined4 *)(puVar21 + 3) = *(undefined4 *)(puVar17 + 3);
      *(undefined4 *)((long)puVar21 + 0x1c) = uVar5;
      *(undefined4 *)(puVar21 + 4) = uVar6;
      *(undefined4 *)((long)puVar21 + 0x24) = uVar7;
      lVar9 = (lVar1 - (ulong)((long)puVar13 + lVar1) % uVar14) + (long)puVar13;
      puVar21[1] = lVar9;
      uVar10 = (*pcVar3)(&local_79,uVar10,lVar9,1);
      puVar21[2] = uVar10;
      puVar13 = (undefined8 *)(puVar21[1] + puVar21[3]);
      puVar17 = puVar17 + 5;
      puVar21 = puVar21 + 5;
    } while (puVar17 != puVar2);
  }
  puStack_60 = local_48;
  if ((puVar21 != local_48) && (0x3f < local_58)) {
    puVar17 = local_48;
    if (puVar21 != (undefined8 *)local_78._storage) {
      puVar17 = (undefined8 *)(puVar21[-4] + puVar21[-2]);
    }
    lVar9 = local_58 - ((long)puVar17 + (local_58 - 1)) % local_58;
    lVar11 = lVar9 + -1;
    if ((void_pointer)((long)puVar17 + lVar9 + 0xff) <= local_78._end_storage) {
      *(undefined ***)((long)puVar17 + lVar11) = &PTR___cxa_pure_virtual_002b4808;
      LOCK();
      UNLOCK();
      _Var8._M_i = (Interface::last_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
      ((__atomic_base<unsigned_long> *)((long)puVar17 + lVar9 + 7))->_M_i =
           (__int_type)Interface::last_id.super___atomic_base<unsigned_long>._M_i;
      Interface::last_id.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var8._M_i;
      *(undefined1 *)((long)puVar17 + lVar9 + 0xf) = 0;
      *(undefined ***)((long)puVar17 + lVar11) = &PTR_function_002b4840;
      uVar10 = *(undefined8 *)(local_40 + 0x20);
      puVar2 = (undefined8 *)((long)puVar17 + lVar9 + 0x17);
      *puVar2 = *(undefined8 *)(local_40 + 0x18);
      puVar2[1] = uVar10;
      *(undefined8 *)(local_40 + 0x18) = 0;
      *(undefined8 *)(local_40 + 0x20) = 0;
      uVar10 = *(undefined8 *)(local_40 + 0x30);
      puVar2 = (undefined8 *)((long)puVar17 + lVar9 + 0x27);
      *puVar2 = *(undefined8 *)(local_40 + 0x28);
      puVar2[1] = uVar10;
      *(undefined8 *)((long)puVar17 + lVar9 + 0x37) = *(undefined8 *)(local_40 + 0x38);
      *(undefined8 *)(local_40 + 0x28) = 0;
      *(undefined8 *)(local_40 + 0x30) = 0;
      *(undefined8 *)(local_40 + 0x38) = 8;
      *(undefined8 *)((long)puVar17 + lVar9 + 0x3f) = *(undefined8 *)(local_40 + 0x40);
      *(undefined8 *)(local_40 + 0x40) = 0;
      *(undefined4 *)((long)puVar17 + lVar9 + 0x47) = 0xdeadbeef;
      *puVar21 = delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>
                 ::clone_func<Impl2T<poly::virtual_cloning_policy>>;
      puVar21[1] = (long)puVar17 + lVar11;
      puVar21[2] = (long)puVar17 + lVar11;
      puVar21[3] = 0x100;
      puVar21[4] = 0x40;
      puVar17 = *(undefined8 **)local_38;
      pvVar4 = *(void_pointer *)(local_38 + 8);
      *(undefined4 *)local_38 = local_78._storage._0_4_;
      *(undefined4 *)(local_38 + 4) = local_78._storage._4_4_;
      *(undefined4 *)(local_38 + 8) = local_78._end_storage._0_4_;
      *(undefined4 *)(local_38 + 0xc) = local_78._end_storage._4_4_;
      puVar2 = *(undefined8 **)(local_38 + 0x10);
      *(undefined8 **)(local_38 + 0x10) = puVar21 + 5;
      puStack_60 = *(undefined8 **)(local_38 + 0x18);
      *(undefined8 **)(local_38 + 0x18) = local_48;
      uVar10 = *(undefined8 *)(local_38 + 0x20);
      *(ulong *)(local_38 + 0x20) = local_58;
      local_78._storage = puVar17;
      local_78._end_storage = pvVar4;
      local_68 = puVar2;
      local_58 = uVar10;
      for (; puVar2 != puVar17; puVar17 = puVar17 + 5) {
        (**(code **)(*(long *)puVar17[2] + 0x18))();
        puVar17[2] = 0;
        puVar17[3] = 0;
        *puVar17 = 0;
        puVar17[1] = 0;
        puVar17[4] = 0;
      }
      local_58 = 8;
      puVar17 = (undefined8 *)local_78._storage;
      if (((ulong)((long)puStack_60 - (long)local_78._storage) / 5 & 0xfffffffffffffff8) * 5 != 0) {
        do {
          puVar17[3] = 0;
          puVar17[4] = 0;
          puVar17[1] = 0;
          puVar17[2] = 0;
          puVar17 = puVar17 + 5;
        } while (puVar17 !=
                 (undefined8 *)
                 ((long)local_78._storage +
                 ((ulong)((long)puStack_60 - (long)local_78._storage) / 0x28) * 5 * 8));
      }
      local_68 = (undefined8 *)0x0;
      puStack_60 = (undefined8 *)0x0;
      operator_delete(local_78._storage,(long)local_78._end_storage - (long)local_78._storage);
      local_78._storage = (void_pointer)0x0;
      local_78._end_storage = (void_pointer)0x0;
      operator_delete((void *)0x0,0);
      return;
    }
  }
  local_68 = puVar21;
  __assert_fail("can_construct_new_elem(s, a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5a9,
                "void poly::vector<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>, CloningPolicy = poly::delegate_cloning_policy<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, true>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>, T = Impl2T<poly::virtual_cloning_policy>, Args = <Impl2T<poly::virtual_cloning_policy>>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}